

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadFurBall(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 *puVar4;
  XML *pXVar5;
  string *childID;
  pointer pTVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  undefined8 uVar11;
  value_type *pvVar12;
  Vec3fa *pVVar13;
  Vec3fx *ptr;
  Ref<embree::SceneGraph::MaterialNode> RVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  size_t i_5;
  GroupNode *this_00;
  TriangleMeshNode *pTVar18;
  HairSetNode *this_01;
  avector<Vec3ff> *paVar19;
  long lVar20;
  sbyte sVar21;
  int iVar22;
  size_t i;
  size_t siglen;
  pointer siglen_00;
  undefined8 *in_RDX;
  uchar *sig;
  uchar *extraout_RDX;
  pointer pTVar23;
  pointer extraout_RDX_00;
  uint uVar24;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *vertices;
  uint32_t *puVar25;
  bool bVar26;
  uint uVar27;
  anon_class_32_4_e296e6a9 *__args;
  pointer ctx;
  pointer in_R8;
  size_t in_R9;
  int i_3;
  long lVar28;
  long lVar29;
  int iVar30;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *this_02;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *this_03;
  int iVar31;
  __atomic_base<unsigned_long> _Var32;
  ulong uVar33;
  HairSetNode *this_04;
  int iVar34;
  int iVar35;
  __atomic_base<unsigned_long> _Var36;
  __atomic_base<unsigned_long> _Var37;
  long lVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  vfloat4 a_6;
  float fVar52;
  float fVar53;
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [12];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar60;
  float fVar63;
  float fVar64;
  vfloat4 b0;
  float fVar65;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vfloat4 a_1;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  vfloat4 a_3;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar81;
  vfloat4 a_4;
  float fVar82;
  float fVar83;
  float fVar84;
  vfloat4 b1;
  vfloat4 a0;
  RTCGeometryType RStack_2d0;
  bool local_2bc;
  byte local_2b8;
  byte local_2b4;
  anon_class_32_4_e296e6a9 rand_float;
  undefined1 local_278 [32];
  string phairtype;
  RTCGeometryType local_218;
  uint local_208;
  int offset_a;
  value_type local_1d8;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  TriangleMeshNode *local_1a0;
  value_type local_198;
  pointer local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  HairSetNode *local_168;
  ulong local_160;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  value_type local_148;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  ulong local_110;
  Ref<embree::SceneGraph::MaterialNode> local_108;
  Ref<embree::SceneGraph::MaterialNode> local_100;
  Ref<embree::SceneGraph::MaterialNode> material;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  float local_a8;
  uint32_t m;
  uint32_t c;
  uint32_t a;
  uint32_t rand_int;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar73 [16];
  
  this_00 = (GroupNode *)::operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_00,0);
  (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
  pXVar5 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&rand_float,"radius",(allocator *)&local_1d8);
  XML::parm(&phairtype,pXVar5,(string *)&rand_float);
  bVar15 = std::operator!=(&phairtype,"");
  if (bVar15) {
    pXVar5 = (XML *)*in_RDX;
    std::__cxx11::string::string((string *)local_278,"radius",(allocator *)&local_198);
    local_1b8._0_4_ = XML::parm_float(pXVar5,(string *)local_278);
    local_1b8._4_4_ = extraout_XMM0_Db;
    fStack_1b0 = (float)extraout_XMM0_Dc;
    fStack_1ac = (float)extraout_XMM0_Dd;
    std::__cxx11::string::~string((string *)local_278);
  }
  else {
    _local_1b8 = ZEXT812(0x41200000);
    fStack_1ac = 0.0;
  }
  std::__cxx11::string::~string((string *)&phairtype);
  std::__cxx11::string::~string((string *)&rand_float);
  pXVar5 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&rand_float,"slices",(allocator *)&local_1d8);
  XML::parm(&phairtype,pXVar5,(string *)&rand_float);
  bVar15 = std::operator!=(&phairtype,"");
  if (bVar15) {
    pXVar5 = (XML *)*in_RDX;
    std::__cxx11::string::string((string *)local_278,"slices",(allocator *)&local_198);
    fVar40 = XML::parm_float(pXVar5,(string *)local_278);
    local_208 = (uint)fVar40;
    std::__cxx11::string::~string((string *)local_278);
  }
  else {
    local_208 = 0x3c;
  }
  std::__cxx11::string::~string((string *)&phairtype);
  std::__cxx11::string::~string((string *)&rand_float);
  pXVar5 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&rand_float,"slabs",(allocator *)&local_1d8);
  XML::parm(&phairtype,pXVar5,(string *)&rand_float);
  bVar15 = std::operator!=(&phairtype,"");
  if (bVar15) {
    pXVar5 = (XML *)*in_RDX;
    std::__cxx11::string::string((string *)local_278,"slabs",(allocator *)&local_198);
    fVar40 = XML::parm_float(pXVar5,(string *)local_278);
    iVar34 = (int)fVar40;
    std::__cxx11::string::~string((string *)local_278);
  }
  else {
    iVar34 = 0x3c;
  }
  std::__cxx11::string::~string((string *)&phairtype);
  std::__cxx11::string::~string((string *)&rand_float);
  pXVar5 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&rand_float,"nhairs",(allocator *)&local_1d8);
  XML::parm(&phairtype,pXVar5,(string *)&rand_float);
  bVar15 = std::operator!=(&phairtype,"");
  local_160 = 30000;
  if (bVar15) {
    pXVar5 = (XML *)*in_RDX;
    std::__cxx11::string::string((string *)local_278,"nhairs",(allocator *)&local_198);
    fVar40 = XML::parm_float(pXVar5,(string *)local_278);
    local_160 = (ulong)(uint)(int)fVar40;
    std::__cxx11::string::~string((string *)local_278);
  }
  std::__cxx11::string::~string((string *)&phairtype);
  std::__cxx11::string::~string((string *)&rand_float);
  pXVar5 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&rand_float,"hairwidth",(allocator *)&local_1d8);
  XML::parm(&phairtype,pXVar5,(string *)&rand_float);
  bVar15 = std::operator!=(&phairtype,"");
  if (bVar15) {
    pXVar5 = (XML *)*in_RDX;
    std::__cxx11::string::string((string *)local_278,"hairwidth",(allocator *)&local_198);
    fVar40 = XML::parm_float(pXVar5,(string *)local_278);
    local_128 = (float)(int)fVar40;
    fStack_124 = (float)(int)extraout_var._0_4_;
    fStack_120 = (float)(int)extraout_var._4_4_;
    fStack_11c = (float)(int)extraout_var._8_4_;
    std::__cxx11::string::~string((string *)local_278);
  }
  else {
    local_128 = (float)local_1b8._0_4_ / 100.0;
    fStack_124 = (float)local_1b8._4_4_;
    fStack_120 = fStack_1b0;
    fStack_11c = fStack_1ac;
  }
  std::__cxx11::string::~string((string *)&phairtype);
  std::__cxx11::string::~string((string *)&rand_float);
  pXVar5 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&rand_float,"hairlength",(allocator *)&local_1d8);
  XML::parm(&phairtype,pXVar5,(string *)&rand_float);
  bVar15 = std::operator!=(&phairtype,"");
  if (bVar15) {
    pXVar5 = (XML *)*in_RDX;
    std::__cxx11::string::string((string *)local_278,"hairlength",(allocator *)&local_198);
    fVar40 = XML::parm_float(pXVar5,(string *)local_278);
    local_a8 = (float)(int)fVar40;
    std::__cxx11::string::~string((string *)local_278);
  }
  else {
    local_a8 = (float)local_1b8._0_4_ / 10.0;
  }
  std::__cxx11::string::~string((string *)&phairtype);
  std::__cxx11::string::~string((string *)&rand_float);
  pXVar5 = (XML *)*in_RDX;
  std::__cxx11::string::string((string *)&rand_float,"hairtype",(allocator *)local_278);
  XML::parm(&phairtype,pXVar5,(string *)&rand_float);
  std::__cxx11::string::~string((string *)&rand_float);
  bVar16 = std::operator==(&phairtype,"linear_flat");
  bVar15 = true;
  if (bVar16) {
    RStack_2d0 = RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE;
LAB_00177188:
    local_218 = RStack_2d0;
    bVar16 = false;
LAB_00177198:
    local_2b4 = 0;
LAB_001771a0:
    local_2b8 = 1;
LAB_001771a6:
    bVar26 = false;
  }
  else {
    bVar16 = std::operator==(&phairtype,"linear_round");
    if (bVar16) {
      RStack_2d0 = RTC_GEOMETRY_TYPE_ROUND_LINEAR_CURVE;
      goto LAB_00177188;
    }
    bVar15 = std::operator==(&phairtype,"bezier_flat");
    bVar16 = true;
    if (bVar15) {
      RStack_2d0 = RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;
LAB_0017789d:
      local_218 = RStack_2d0;
      bVar15 = false;
      goto LAB_00177198;
    }
    bVar15 = std::operator==(&phairtype,"bezier_round");
    if (bVar15) {
      RStack_2d0 = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;
      goto LAB_0017789d;
    }
    bVar15 = std::operator==(&phairtype,"bezier_normaloriented");
    if (bVar15) {
      bVar16 = true;
      local_218 = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE;
      local_2bc = true;
      bVar26 = false;
LAB_001786b9:
      local_2b8 = 1;
      bVar15 = false;
      local_2b4 = 0;
      goto LAB_001771b0;
    }
    bVar15 = std::operator==(&phairtype,"bspline_flat");
    local_2b4 = 1;
    if (bVar15) {
      RStack_2d0 = RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;
LAB_001786f8:
      local_218 = RStack_2d0;
      bVar15 = false;
      bVar16 = false;
      goto LAB_001771a0;
    }
    bVar15 = std::operator==(&phairtype,"bspline_round");
    if (bVar15) {
      RStack_2d0 = RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE;
      goto LAB_001786f8;
    }
    bVar15 = std::operator==(&phairtype,"bspline_normaloriented");
    local_2bc = true;
    if (bVar15) {
      local_218 = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE;
      local_2b4 = 1;
      local_2b8 = 1;
LAB_00178756:
      bVar16 = false;
      bVar15 = false;
      bVar26 = false;
      goto LAB_001771b0;
    }
    bVar15 = std::operator==(&phairtype,"hermite_flat");
    if (bVar15) {
      local_218 = RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;
LAB_0017878d:
      bVar15 = false;
      bVar16 = false;
      local_2b4 = 0;
      local_2b8 = 0;
      goto LAB_001771a6;
    }
    bVar15 = std::operator==(&phairtype,"hermite_round");
    if (bVar15) {
      local_218 = RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE;
      goto LAB_0017878d;
    }
    bVar15 = std::operator==(&phairtype,"hermite_normaloriented");
    if (bVar15) {
      local_218 = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE;
      local_2b4 = 0;
      local_2b8 = 0;
      goto LAB_00178756;
    }
    bVar15 = std::operator==(&phairtype,"catmulrom_flat");
    local_2b8 = 1;
    if (bVar15) {
      local_218 = RTC_GEOMETRY_TYPE_FLAT_CATMULL_ROM_CURVE;
    }
    else {
      bVar15 = std::operator==(&phairtype,"catmulrom_round");
      if (!bVar15) {
        local_2bc = std::operator==(&phairtype,"catmulrom_normaloriented");
        local_218 = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;
        if (local_2bc) {
          local_218 = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_CATMULL_ROM_CURVE;
        }
        bVar16 = !local_2bc;
        bVar26 = local_2bc;
        goto LAB_001786b9;
      }
      local_218 = RTC_GEOMETRY_TYPE_ROUND_CATMULL_ROM_CURVE;
    }
    bVar15 = false;
    bVar16 = false;
    local_2b4 = 0;
    bVar26 = true;
  }
  local_2bc = false;
LAB_001771b0:
  childID = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&rand_float,"material",(allocator *)&local_1d8);
  XML::child((XML *)local_278,childID);
  loadMaterial((XMLLoader *)&material,xml);
  if ((long *)local_278._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_278._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)&rand_float);
  pTVar18 = (TriangleMeshNode *)::operator_new(0xd8);
  RVar14 = material;
  local_100 = (Ref<embree::SceneGraph::MaterialNode>)
              (Ref<embree::SceneGraph::MaterialNode>)material.ptr;
  local_1a0 = pTVar18;
  if (material.ptr != (MaterialNode *)0x0) {
    (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(material.ptr);
  }
  SceneGraph::TriangleMeshNode::TriangleMeshNode(pTVar18,&local_100,(BBox1f)0x3f80000000000000,0);
  (*(pTVar18->super_Node).super_RefCount._vptr_RefCount[2])(pTVar18);
  if (local_100.ptr != (MaterialNode *)0x0) {
    (*((local_100.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  iVar17 = iVar34 + -1;
  puVar25 = (uint32_t *)((long)(int)(iVar17 * local_208) + 2);
  rand_float.m = (uint32_t *)0x0;
  rand_float.a = (uint32_t *)0x0;
  rand_float.c = (uint32_t *)0x0;
  rand_float.m = (uint32_t *)alignedMalloc((long)puVar25 * 0x10,0x10);
  iVar31 = 0;
  alignedFree((void *)0x0);
  local_178 = (pointer)((ulong)(local_1b8._0_4_ ^ 0x80000000) << 0x20);
  uStack_170 = 0;
  uStack_16c = 0;
  *rand_float.m = 0;
  rand_float.m[1] = local_1b8._0_4_ ^ 0x80000000;
  rand_float.m[2] = 0;
  rand_float.m[3] = 0;
  local_158._0_4_ = 3.1415927 / (float)(int)local_208 + 3.1415927 / (float)(int)local_208;
  uVar24 = 0;
  if (0 < (int)local_208) {
    uVar24 = local_208;
  }
  if (iVar17 < 1) {
    iVar17 = 0;
  }
  iVar30 = 0;
  rand_float.a = puVar25;
  rand_float.c = puVar25;
  while (pTVar18 = local_1a0, lVar28 = (long)iVar31, iVar30 != iVar17) {
    iVar30 = iVar30 + 1;
    fVar40 = (float)iVar30 * (3.1415927 / (float)iVar34);
    lVar28 = lVar28 << 4;
    for (uVar27 = 0; uVar24 != uVar27; uVar27 = uVar27 + 1) {
      fVar41 = (float)(int)uVar27 * (float)local_158._0_4_;
      fVar42 = sinf(fVar40);
      fVar42 = fVar42 * (float)local_1b8._0_4_;
      fVar43 = cosf(fVar41);
      fVar44 = sinf(fVar40);
      fVar44 = fVar44 * (float)local_1b8._0_4_;
      fVar41 = sinf(fVar41);
      fVar45 = cosf(fVar40);
      auVar67._4_4_ = fVar45 * (float)local_1b8._0_4_;
      auVar67._0_4_ = fVar43 * fVar42;
      auVar67._8_4_ = fVar41 * fVar44;
      auVar67._12_4_ = 0;
      *(undefined1 (*) [16])((long)rand_float.m + lVar28) = auVar67;
      lVar28 = lVar28 + 0x10;
    }
    iVar31 = iVar31 + uVar27;
  }
  *(undefined1 (*) [16])(rand_float.m + lVar28 * 4) = ZEXT416(local_1b8._0_4_) << 0x20;
  *(pointer *)(rand_float.m + lVar28 * 4 + 4) = local_178;
  *(ulong *)((long)(rand_float.m + lVar28 * 4 + 4) + 8) = CONCAT44(uStack_16c,uStack_170);
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::push_back(&local_1a0->positions,(value_type *)&rand_float);
  local_158._0_4_ = uVar24;
  alignedFree(rand_float.m);
  iVar17 = (int)(pTVar18->positions).
                super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].size_active;
  local_110 = (ulong)(iVar17 - 1);
  this_02 = &pTVar18->triangles;
  iVar31 = local_158._0_4_;
  iVar30 = 0;
  while (bVar39 = iVar31 != 0, iVar31 = iVar31 + -1, bVar39) {
    rand_float.rand_int = (uint32_t *)CONCAT44(iVar30,iVar17 + -2);
    rand_float.a = (uint32_t *)CONCAT44(rand_float.a._4_4_,(iVar30 + 1) % (int)local_208);
    std::
    vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
    ::emplace_back<embree::SceneGraph::TriangleMeshNode::Triangle>(this_02,(Triangle *)&rand_float);
    iVar30 = iVar30 + 1;
  }
  iVar17 = 2;
  if (2 < iVar34) {
    iVar17 = iVar34;
  }
  siglen = 0;
  __args = &rand_float;
  sig = (uchar *)0x0;
  while (iVar34 = (int)sig, iVar34 != iVar17 + -2) {
    local_178 = (pointer)CONCAT44(local_178._4_4_,iVar34 + 1);
    iVar31 = 1;
    iVar22 = (int)siglen;
    iVar30 = local_158._0_4_;
    while (bVar39 = iVar30 != 0, iVar30 = iVar30 + -1, bVar39) {
      iVar10 = (int)siglen;
      iVar35 = (iVar34 + 1) * local_208 + iVar31 % (int)local_208;
      rand_float.rand_int = (uint32_t *)CONCAT44(local_208 + iVar10,iVar10);
      rand_float.a = (uint32_t *)CONCAT44(rand_float.a._4_4_,iVar35);
      std::
      vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
      ::emplace_back<embree::SceneGraph::TriangleMeshNode::Triangle>(this_02,(Triangle *)__args);
      rand_float.rand_int = (uint32_t *)CONCAT44(iVar35,iVar10);
      rand_float.a = (uint32_t *)
                     CONCAT44(rand_float.a._4_4_,iVar31 % (int)local_208 + iVar34 * local_208);
      std::
      vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
      ::emplace_back<embree::SceneGraph::TriangleMeshNode::Triangle>(this_02,(Triangle *)__args);
      siglen = (size_t)(iVar10 + 1);
      iVar31 = iVar31 + 1;
    }
    siglen = (size_t)(iVar22 + local_208);
    sig = (uchar *)((ulong)local_178 & 0xffffffff);
  }
  iVar31 = (int)local_110;
  iVar34 = ~local_208 + iVar31;
  iVar17 = 0;
  while (pTVar18 = local_1a0, local_158._0_4_ != iVar17) {
    uVar24 = iVar34 + iVar17;
    siglen = (size_t)uVar24;
    iVar17 = iVar17 + 1;
    rand_float.rand_int = (uint32_t *)CONCAT44(uVar24,iVar31);
    rand_float.a = (uint32_t *)CONCAT44(rand_float.a._4_4_,iVar17 % (int)local_208 + iVar34);
    __args = &rand_float;
    std::
    vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
    ::emplace_back<embree::SceneGraph::TriangleMeshNode::Triangle>(this_02,(Triangle *)&rand_float);
    sig = extraout_RDX;
  }
  SceneGraph::TriangleMeshNode::verify
            (local_1a0,(EVP_PKEY_CTX *)__args,sig,siglen,(uchar *)in_R8,in_R9);
  rand_float.rand_int = (uint32_t *)pTVar18;
  (*(pTVar18->super_Node).super_RefCount._vptr_RefCount[2])(pTVar18);
  SceneGraph::GroupNode::add(this_00,(Ref<embree::SceneGraph::Node> *)&rand_float);
  if (rand_float.rand_int != (uint32_t *)0x0) {
    (**(code **)(*(long *)rand_float.rand_int + 0x18))();
  }
  this_01 = (HairSetNode *)::operator_new(0x118);
  local_108 = (Ref<embree::SceneGraph::MaterialNode>)
              (Ref<embree::SceneGraph::MaterialNode>)RVar14.ptr;
  local_168 = this_01;
  if (RVar14.ptr != (MaterialNode *)0x0) {
    (*((RVar14.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(RVar14.ptr);
  }
  SceneGraph::HairSetNode::HairSetNode(this_01,local_218,&local_108,(BBox1f)0x3f80000000000000,0);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  if (local_108.ptr != (MaterialNode *)0x0) {
    (*((local_108.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  rand_float.rand_int = &rand_int;
  rand_int = 0x4d2;
  rand_float.a = &a;
  a = 0x41c64e6d;
  rand_float.c = &c;
  c = 0x3039;
  rand_float.m = &m;
  m = 0x80000000;
  local_278._24_8_ = (void *)0x0;
  local_1d8.items = (Vec3fa *)0x0;
  local_198.items = (Vec3fx *)0x0;
  local_178 = (pointer)(long)(int)local_160;
  siglen_00 = (pointer)((ulong)local_2b8 + 1);
  sVar21 = (sbyte)siglen_00;
  _Var32._M_i = (long)local_178 << sVar21;
  local_278._8_8_ = 0;
  local_278._16_8_ = (avector<Vec3ff> *)0x0;
  local_148.items = (Vec3fa *)0x0;
  local_1d8.size_active = 0;
  local_1d8.size_alloced = 0;
  local_198.size_active = 0;
  local_198.size_alloced = 0;
  local_148.size_active = 0;
  local_148.size_alloced = 0;
  if ((int)local_160 == 0) {
    paVar19 = (avector<Vec3ff> *)0x0;
    _Var36._M_i = (__int_type)(avector<Vec3ff> *)0x0;
  }
  else {
    local_278._24_8_ = alignedMalloc(_Var32._M_i << 4,0x10);
    alignedFree((void *)0x0);
    paVar19 = (avector<Vec3ff> *)local_1d8.size_alloced;
    _Var36._M_i = local_1d8.size_alloced;
    local_278._16_8_ = _Var32._M_i;
    if (local_1d8.size_alloced < _Var32._M_i) {
      if ((avector<Vec3ff> *)local_1d8.size_alloced == (avector<Vec3ff> *)0x0) {
        paVar19 = (avector<Vec3ff> *)0x0;
        _Var36._M_i = _Var32._M_i;
      }
      else {
        for (; _Var36._M_i < _Var32._M_i;
            _Var36._M_i = (__int_type)(_Var36._M_i * 2 + (ulong)(_Var36._M_i * 2 == 0))) {
        }
      }
    }
  }
  pVVar13 = local_1d8.items;
  if (_Var32._M_i < local_1d8.size_active) {
    local_1d8.size_active = _Var32._M_i;
  }
  local_278._8_8_ = _Var32._M_i;
  if (paVar19 != (avector<Vec3ff> *)_Var36._M_i) {
    local_1d8.items = (Vec3fa *)alignedMalloc(_Var36._M_i << 4,0x10);
    lVar28 = 0;
    for (siglen_00 = (pointer)0x0; siglen_00 < local_1d8.size_active;
        siglen_00 = (pointer)((long)&siglen_00->ty + 1)) {
      puVar1 = (undefined8 *)((long)&pVVar13->field_0 + lVar28);
      uVar11 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(local_1d8.items)->field_0 + lVar28);
      *puVar2 = *puVar1;
      puVar2[1] = uVar11;
      lVar28 = lVar28 + 0x10;
    }
    alignedFree(pVVar13);
    local_1d8.size_alloced = _Var36._M_i;
  }
  ptr = local_198.items;
  local_1d8.size_active = _Var32._M_i;
  _Var36._M_i = local_148.size_active;
  if (local_2b8 == 0) {
    _Var36._M_i = local_198.size_alloced;
    if ((local_198.size_alloced < _Var32._M_i) &&
       (paVar19 = (avector<Vec3ff> *)local_198.size_alloced, _Var36._M_i = _Var32._M_i,
       (avector<Vec3ff> *)local_198.size_alloced != (avector<Vec3ff> *)0x0)) {
      for (; _Var36._M_i = (__int_type)paVar19, paVar19 < _Var32._M_i;
          paVar19 = (avector<Vec3ff> *)((long)paVar19 * 2 + (ulong)((long)paVar19 * 2 == 0))) {
      }
    }
    if (_Var32._M_i < local_198.size_active) {
      local_198.size_active = _Var32._M_i;
    }
    if (local_198.size_alloced != _Var36._M_i) {
      local_198.items = (Vec3fx *)alignedMalloc(_Var36._M_i << 4,0x10);
      lVar28 = 0;
      for (siglen_00 = (pointer)0x0; siglen_00 < local_198.size_active;
          siglen_00 = (pointer)((long)&siglen_00->ty + 1)) {
        puVar1 = (undefined8 *)((long)&ptr->field_0 + lVar28);
        uVar11 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(local_198.items)->field_0 + lVar28);
        *puVar2 = *puVar1;
        puVar2[1] = uVar11;
        lVar28 = lVar28 + 0x10;
      }
      alignedFree(ptr);
      local_198.size_alloced = _Var36._M_i;
    }
    pVVar13 = local_148.items;
    _Var37._M_i = local_148.size_alloced;
    if ((local_148.size_alloced < _Var32._M_i) &&
       (paVar19 = (avector<Vec3ff> *)local_148.size_alloced, _Var37._M_i = _Var32._M_i,
       (avector<Vec3ff> *)local_148.size_alloced != (avector<Vec3ff> *)0x0)) {
      for (; _Var37._M_i = (__int_type)paVar19, paVar19 < _Var32._M_i;
          paVar19 = (avector<Vec3ff> *)((long)paVar19 * 2 + (ulong)((long)paVar19 * 2 == 0))) {
      }
    }
    if (_Var32._M_i < local_148.size_active) {
      local_148.size_active = _Var32._M_i;
    }
    local_198.size_active = _Var32._M_i;
    _Var36._M_i = _Var32._M_i;
    if (local_148.size_alloced != _Var37._M_i) {
      local_148.items = (Vec3fa *)alignedMalloc(_Var37._M_i << 4,0x10);
      lVar28 = 0;
      for (siglen_00 = (pointer)0x0; siglen_00 < local_148.size_active;
          siglen_00 = (pointer)((long)&siglen_00->ty + 1)) {
        puVar1 = (undefined8 *)((long)&pVVar13->field_0 + lVar28);
        uVar11 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(local_148.items)->field_0 + lVar28);
        *puVar2 = *puVar1;
        puVar2[1] = uVar11;
        lVar28 = lVar28 + 0x10;
      }
      alignedFree(pVVar13);
      local_148.size_alloced = _Var37._M_i;
    }
  }
  local_148.size_active = _Var36._M_i;
  fVar40 = loadFurBall::anon_class_32_4_e296e6a9::operator()(&rand_float);
  fVar41 = loadFurBall::anon_class_32_4_e296e6a9::operator()(&rand_float);
  fVar41 = acosf(1.0 - (fVar41 + fVar41));
  fVar42 = sinf(fVar41);
  fVar43 = cosf(fVar40 * 6.2831855);
  fVar43 = fVar43 * fVar42;
  fVar42 = cosf(fVar41);
  fVar41 = sinf(fVar41);
  fVar40 = sinf(fVar40 * 6.2831855);
  fVar40 = fVar40 * fVar41;
  fVar57 = 0.0;
  local_1b8._4_4_ = local_1b8._0_4_;
  fStack_1b0 = (float)local_1b8._0_4_;
  fStack_1ac = (float)local_1b8._0_4_;
  fVar41 = local_a8 * -0.01 + 1.0;
  local_110 = CONCAT44(local_110._4_4_,local_a8 * 0.03);
  fVar44 = local_a8 * 0.03 + 1.0;
  fVar45 = local_a8 * 0.07 + 1.0;
  local_58 = ZEXT416((uint)(local_128 * 0.5));
  lVar28 = 0;
  uVar33 = 0;
  if (0 < (int)local_160) {
    uVar33 = local_160 & 0xffffffff;
  }
  lVar38 = 1;
  lVar29 = 0;
  do {
    this_04 = local_168;
    if (uVar33 * 0x20 == lVar28) {
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::push_back(&this_01->positions,(value_type *)local_278);
      if (local_2bc != false) {
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::push_back(&this_01->normals,&local_1d8);
      }
      if ((local_2b8 == 0) &&
         (std::
          vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ::push_back(&this_01->tangents,&local_198), local_2bc != false)) {
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::push_back(&this_01->dnormals,&local_148);
      }
      this_03 = &this_01->hairs;
      if (bVar15) {
        std::
        vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
        ::resize(this_03,(long)((int)local_160 * 3));
        lVar28 = 0;
        siglen_00 = (pointer)0x200000002;
        pTVar23 = (pointer)0x300000000;
        ctx = (pointer)0x0;
        lVar38 = 0;
        in_R8 = local_178;
        while (bVar15 = in_R8 != (pointer)0x0, in_R8 = (pointer)((long)&in_R8[-1].loc.colNumber + 7)
              , bVar15) {
          lVar29 = (long)&ctx->ty + lVar38;
          *(long *)((long)&((this_03->
                            super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                            )._M_impl.super__Vector_impl_data._M_start)->vertex + lVar28) = lVar29;
          *(long *)((long)&(this_03->
                           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           )._M_impl.super__Vector_impl_data._M_start[1].vertex + lVar28) =
               lVar29 + 0x100000001;
          in_R9 = lVar29 + 0x200000002;
          *(size_t *)
           ((long)&(this_03->
                   super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                   )._M_impl.super__Vector_impl_data._M_start[2].vertex + lVar28) = in_R9;
          lVar38 = lVar38 + 0x300000000;
          ctx = (pointer)(ulong)((int)ctx + 4);
          lVar28 = lVar28 + 0x18;
        }
      }
      else {
        ctx = local_178;
        std::
        vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
        ::resize(this_03,(size_type)local_178);
        lVar28 = 0;
        for (pTVar23 = (pointer)0x0; local_178 != pTVar23;
            pTVar23 = (pointer)((long)&pTVar23->ty + 1)) {
          siglen_00 = (pointer)(this_03->
                               super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                               )._M_impl.super__Vector_impl_data._M_start;
          ctx = (pointer)((ulong)((uint)((long)pTVar23 << sVar21) & 0xfffffffe) + lVar28);
          *(pointer *)
           (((anon_union_16_2_47237d3f_for_Vec3fx_0 *)&siglen_00->ty)->m128 + (long)pTVar23 * 2) =
               ctx;
          lVar28 = lVar28 + 0x100000000;
        }
      }
      if ((bVar26 | local_2b4) == 1) {
        lVar28 = 0;
        siglen_00 = local_178;
        while (bVar15 = siglen_00 != (pointer)0x0,
              siglen_00 = (pointer)((long)&siglen_00[-1].loc.colNumber + 7), bVar15) {
          *(undefined4 *)
           ((long)&(this_04->positions).
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].items[1].field_0 + lVar28 + 0xc) =
               local_58._0_4_;
          *(float *)((long)&(this_04->positions).
                            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].items[2].field_0 +
                    lVar28 + 0xc) = local_128 * 0.01;
          pTVar23 = (pointer)(this_04->positions).
                             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].items;
          *(undefined4 *)((long)&(pTVar23->loc).lineNumber + lVar28 + 4) = 0;
          lVar28 = lVar28 + 0x40;
        }
      }
      if (local_2b4 != 0) {
        indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ctx = local_178;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                  (&indices,(size_type)local_178);
        for (pTVar23 = (pointer)0x0; local_178 != pTVar23;
            pTVar23 = (pointer)((long)((anon_union_16_2_47237d3f_for_Vec3fx_0 *)&pTVar23->ty)->m128
                               + 1)) {
          indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[(long)pTVar23] = (uint)pTVar23;
          siglen_00 = (pointer)indices.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
        }
        pTVar6 = (pointer)(this_04->positions).
                          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
        for (pTVar23 = (pointer)(this_04->positions).
                                super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start; pTVar23 != pTVar6;
            pTVar23 = (pointer)((pTVar23->str).field_2._M_local_buf + 8)) {
          ctx = pTVar23;
          fix_bspline_end_points(&indices,(avector<Vec3ff> *)pTVar23);
        }
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        pTVar23 = extraout_RDX_00;
        this_04 = local_168;
      }
      SceneGraph::HairSetNode::verify
                (this_04,(EVP_PKEY_CTX *)ctx,(uchar *)pTVar23,(size_t)siglen_00,(uchar *)in_R8,in_R9
                );
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this_04;
      (*(this_04->super_Node).super_RefCount._vptr_RefCount[2])(this_04);
      SceneGraph::GroupNode::add(this_00,(Ref<embree::SceneGraph::Node> *)&indices);
      if (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + 0x18))();
      }
      alignedFree(local_148.items);
      alignedFree(local_198.items);
      alignedFree(local_1d8.items);
      alignedFree((void *)local_278._24_8_);
      (this->path).filename._M_dataplus._M_p = (pointer)this_00;
      (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
      (*(this_04->super_Node).super_RefCount._vptr_RefCount[3])(this_04);
      (*(local_1a0->super_Node).super_RefCount._vptr_RefCount[3])();
      if (material.ptr != (MaterialNode *)0x0) {
        (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      std::__cxx11::string::~string((string *)&phairtype);
      (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x18))(this_00);
      return (Ref<embree::SceneGraph::Node>)(Node *)this;
    }
    fVar46 = loadFurBall::anon_class_32_4_e296e6a9::operator()(&rand_float);
    fVar47 = loadFurBall::anon_class_32_4_e296e6a9::operator()(&rand_float);
    fVar47 = acosf(1.0 - (fVar47 + fVar47));
    fVar48 = sinf(fVar47);
    fVar49 = cosf(fVar46 * 6.2831855);
    fVar49 = fVar49 * fVar48;
    fVar48 = cosf(fVar47);
    fVar47 = sinf(fVar47);
    fVar46 = sinf(fVar46 * 6.2831855);
    fVar46 = fVar46 * fVar47;
    local_158._4_4_ = fVar46;
    local_158._0_4_ = fVar48;
    fStack_150 = fVar49;
    fStack_14c = 0.0;
    fVar47 = fVar42 * fVar49 - fVar43 * fVar48;
    fVar52 = fVar40 * fVar48 - fVar42 * fVar46;
    fVar42 = fVar43 * fVar46 - fVar40 * fVar49;
    fVar56 = fVar57 * 0.0 - fVar57 * 0.0;
    fVar40 = fVar52 * fVar52;
    fVar43 = fVar42 * fVar42;
    fVar57 = fVar56 * fVar56;
    fVar72 = fVar43 + fVar40 + fVar47 * fVar47;
    auVar73._0_8_ = CONCAT44(fVar57 + fVar40 + fVar40,fVar72);
    auVar73._8_4_ = fVar43 + fVar40 + fVar43;
    auVar73._12_4_ = fVar57 + fVar40 + fVar57;
    auVar66._8_4_ = auVar73._8_4_;
    auVar66._0_8_ = auVar73._0_8_;
    auVar66._12_4_ = auVar73._12_4_;
    auVar67 = rsqrtss(auVar66,auVar73);
    fVar40 = auVar67._0_4_;
    fVar57 = fVar40 * fVar40 * fVar72 * -0.5 * fVar40 + fVar40 * 1.5;
    fVar43 = fVar57 * fVar52;
    fVar42 = fVar57 * fVar42;
    fVar40 = fVar57 * fVar47;
    fVar57 = fVar57 * fVar56;
    fVar60 = (float)local_1b8._0_4_ * fVar49;
    fVar63 = (float)local_1b8._4_4_ * fVar48;
    fVar64 = fStack_1b0 * fVar46;
    fVar65 = fStack_1ac * 0.0;
    fVar47 = fVar44 * fVar60;
    fVar72 = fVar44 * fVar63;
    fVar54 = fVar44 * fVar64;
    fVar58 = fVar44 * fVar65;
    fVar52 = fVar45 * fVar60;
    fVar53 = fVar45 * fVar63;
    fVar55 = fVar45 * fVar64;
    fVar59 = fVar45 * fVar65;
    fVar56 = loadFurBall::anon_class_32_4_e296e6a9::operator()(&rand_float);
    fVar56 = fVar56 * (float)local_110 + fVar45;
    auVar50._0_4_ = fVar56 * fVar60;
    auVar50._4_4_ = fVar56 * fVar63;
    auVar50._8_4_ = fVar56 * fVar64;
    auVar50._12_4_ = fVar56 * fVar65;
    fVar56 = (float)local_1b8._0_4_ * fVar43;
    fVar80 = (float)local_1b8._4_4_ * fVar42;
    fVar81 = fStack_1b0 * fVar40;
    fVar82 = fStack_1ac * fVar57;
    if (bVar16) {
      auVar50._0_4_ = auVar50._0_4_ + fVar56 * 0.051 * local_a8;
      auVar50._4_4_ = auVar50._4_4_ + fVar80 * 0.051 * local_a8;
      auVar50._8_4_ = auVar50._8_4_ + fVar81 * 0.051 * local_a8;
      auVar50._12_4_ = auVar50._12_4_ + fVar82 * 0.051 * local_a8;
    }
    else if (bVar15) {
      fVar47 = fVar47 + fVar56 * 0.001 * local_a8;
      fVar72 = fVar72 + fVar80 * 0.001 * local_a8;
      fVar54 = fVar54 + fVar81 * 0.001 * local_a8;
      fVar58 = fVar58 + fVar82 * 0.001 * local_a8;
      fVar52 = fVar52 + fVar56 * 0.021 * local_a8;
      fVar53 = fVar53 + fVar80 * 0.021 * local_a8;
      fVar55 = fVar55 + fVar81 * 0.021 * local_a8;
      fVar59 = fVar59 + fVar82 * 0.021 * local_a8;
      auVar50._0_4_ = auVar50._0_4_ + fVar56 * 0.051 * local_a8;
      auVar50._4_4_ = auVar50._4_4_ + fVar80 * 0.051 * local_a8;
      auVar50._8_4_ = auVar50._8_4_ + fVar81 * 0.051 * local_a8;
      auVar50._12_4_ = auVar50._12_4_ + fVar82 * 0.051 * local_a8;
    }
    else if (local_2b4 != 0) {
      fVar52 = fVar52 + fVar56 * 0.021 * local_a8;
      fVar53 = fVar53 + fVar80 * 0.021 * local_a8;
      fVar55 = fVar55 + fVar81 * 0.021 * local_a8;
      fVar59 = fVar59 + fVar82 * 0.021 * local_a8;
      local_48 = fVar56;
      fStack_44 = fVar80;
      fStack_40 = fVar81;
      fStack_3c = fVar82;
      fVar56 = loadFurBall::anon_class_32_4_e296e6a9::operator()(&rand_float);
      fVar56 = fVar56 * local_a8 * 0.13 + fVar45;
      auVar50._4_4_ = fStack_44 * 0.081 * local_a8 + fVar56 * fVar63;
      auVar50._0_4_ = local_48 * 0.081 * local_a8 + fVar56 * fVar60;
      auVar50._8_4_ = fStack_40 * 0.081 * local_a8 + fVar56 * fVar64;
      auVar50._12_4_ = fStack_3c * 0.081 * local_a8 + fVar56 * fVar65;
    }
    fVar60 = fVar60 * fVar41;
    fVar63 = fVar63 * fVar41;
    fVar64 = fVar64 * fVar41;
    auVar74._0_12_ = auVar50._0_12_;
    if (local_2b8 == 0) {
      pfVar3 = (float *)(local_278._24_8_ + lVar28);
      *pfVar3 = fVar60;
      pfVar3[1] = fVar63;
      pfVar3[2] = fVar64;
      pfVar3[3] = local_128;
      auVar51._12_4_ = 0;
      auVar51._0_12_ = auVar74._0_12_;
      *(undefined1 (*) [16])(local_278._24_8_ + 0x10 + lVar28) = auVar51;
      fVar47 = fVar48 * fVar48;
      fVar52 = fVar46 * fVar46;
      fVar56 = fVar47 + fVar49 * fVar49 + fVar52;
      auVar70._0_8_ = CONCAT44(fVar47 + fVar47 + 0.0,fVar56);
      auVar70._8_4_ = fVar47 + fVar52 + fVar52;
      auVar70._12_4_ = fVar47 + 0.0 + 0.0;
      auVar77._8_4_ = auVar70._8_4_;
      auVar77._0_8_ = auVar70._0_8_;
      auVar77._12_4_ = auVar70._12_4_;
      auVar67 = rsqrtss(auVar77,auVar70);
      fVar47 = auVar67._0_4_;
      fVar47 = fVar47 * 1.5 - fVar47 * fVar47 * fVar56 * 0.5 * fVar47;
      fVar52 = fVar42 * fVar42;
      fVar56 = fVar40 * fVar40;
      fVar72 = fVar57 * fVar57;
      fVar53 = fVar52 + fVar43 * fVar43 + fVar56;
      auVar78._0_8_ = CONCAT44(fVar52 + fVar52 + fVar72,fVar53);
      auVar78._8_4_ = fVar52 + fVar56 + fVar56;
      auVar78._12_4_ = fVar52 + fVar72 + fVar72;
      auVar71._8_4_ = auVar78._8_4_;
      auVar71._0_8_ = auVar78._0_8_;
      auVar71._12_4_ = auVar78._12_4_;
      auVar67 = rsqrtss(auVar71,auVar78);
      fVar52 = auVar67._0_4_;
      fVar52 = fVar52 * 1.5 - fVar52 * fVar52 * fVar53 * 0.5 * fVar52;
      pfVar3 = (float *)((long)&(local_198.items)->field_0 + lVar28);
      *pfVar3 = fVar47 * fVar49;
      pfVar3[1] = fVar47 * fVar48;
      pfVar3[2] = fVar47 * fVar46;
      pfVar3[3] = 0.2;
      pfVar3 = (float *)((long)&local_198.items[1].field_0 + lVar28);
      *pfVar3 = fVar52 * fVar43;
      pfVar3[1] = fVar52 * fVar42;
      pfVar3[2] = fVar52 * fVar40;
      pfVar3[3] = 0.8;
      fVar47 = fVar42 * fVar49 - (float)local_158._0_4_ * fVar43;
      fVar48 = fVar40 * fVar48 - (float)local_158._4_4_ * fVar42;
      fVar49 = fVar43 * fVar46 - fStack_150 * fVar40;
      fVar56 = fVar57 * 0.0 - fStack_14c * fVar57;
      fVar46 = fVar48 * fVar48;
      fVar52 = fVar49 * fVar49;
      fVar72 = fVar56 * fVar56;
      fVar53 = fVar52 + fVar46 + fVar47 * fVar47;
      auVar79._0_8_ = CONCAT44(fVar72 + fVar46 + fVar46,fVar53);
      auVar79._8_4_ = fVar52 + fVar46 + fVar52;
      auVar79._12_4_ = fVar72 + fVar46 + fVar72;
      auVar62._8_4_ = auVar79._8_4_;
      auVar62._0_8_ = auVar79._0_8_;
      auVar62._12_4_ = auVar79._12_4_;
      auVar67 = rsqrtss(auVar62,auVar79);
      fVar46 = auVar67._0_4_;
      fVar46 = fVar46 * 1.5 - fVar46 * fVar46 * fVar53 * 0.5 * fVar46;
      pfVar3 = (float *)((long)&(local_1d8.items)->field_0 + lVar28);
      *pfVar3 = fVar46 * fVar48;
      pfVar3[1] = fVar46 * fVar49;
      pfVar3[2] = fVar46 * fVar47;
      pfVar3[3] = fVar46 * fVar56;
      pfVar3 = (float *)((long)&local_1d8.items[1].field_0 + lVar28);
      *pfVar3 = fVar46 * fVar48;
      pfVar3[1] = fVar46 * fVar49;
      pfVar3[2] = fVar46 * fVar47;
      pfVar3[3] = fVar46 * fVar56;
      if (local_2bc != false) {
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar49 = 0.0;
        fVar46 = 0.0;
        puVar4 = (undefined4 *)((long)&(local_148.items)->field_0 + lVar28);
        *puVar4 = 0;
        puVar4[1] = 0;
        puVar4[2] = 0;
        puVar4[3] = 0;
        pvVar12 = &local_148;
        lVar20 = lVar38;
        goto LAB_001782ad;
      }
    }
    else {
      pfVar3 = (float *)(local_278._24_8_ + lVar28 * 2);
      *pfVar3 = fVar60;
      pfVar3[1] = fVar63;
      pfVar3[2] = fVar64;
      pfVar3[3] = local_128;
      pfVar3 = (float *)(local_278._24_8_ + 0x10 + lVar28 * 2);
      *pfVar3 = fVar47;
      pfVar3[1] = fVar72;
      pfVar3[2] = fVar54;
      pfVar3[3] = local_128;
      pfVar3 = (float *)(local_278._24_8_ + 0x20 + lVar28 * 2);
      *pfVar3 = fVar47;
      pfVar3[1] = fVar53;
      pfVar3[2] = fVar55;
      pfVar3[3] = local_58._0_4_;
      auVar74._12_4_ = 0;
      *(undefined1 (*) [16])(local_278._24_8_ + 0x30 + lVar28 * 2) = auVar74;
      if ((local_2b8 & local_2bc) != 0) {
        fVar80 = fVar49 * fVar42 - (float)local_158._0_4_ * fVar43;
        fVar81 = fVar48 * fVar40 - (float)local_158._4_4_ * fVar42;
        fVar83 = fVar46 * fVar43 - fStack_150 * fVar40;
        fVar84 = fVar57 * 0.0 - fStack_14c * fVar57;
        fVar82 = fVar81 * fVar81;
        fVar49 = fVar83 * fVar83;
        fVar56 = fVar84 * fVar84;
        fVar48 = fVar49 + fVar82 + fVar80 * fVar80;
        fVar46 = fVar56 + fVar82 + fVar82;
        fVar49 = fVar49 + fVar82 + fVar49;
        fVar56 = fVar56 + fVar82 + fVar56;
        auVar75._4_4_ = fVar46;
        auVar75._0_4_ = fVar48;
        auVar75._8_4_ = fVar49;
        auVar75._12_4_ = fVar56;
        auVar7._4_4_ = fVar46;
        auVar7._0_4_ = fVar48;
        auVar7._8_4_ = fVar49;
        auVar7._12_4_ = fVar56;
        auVar67 = rsqrtss(auVar75,auVar7);
        fVar46 = auVar67._0_4_;
        fVar46 = fVar46 * 1.5 - fVar46 * fVar46 * fVar48 * 0.5 * fVar46;
        pfVar3 = (float *)((long)&(local_1d8.items)->field_0 + lVar28 * 2);
        *pfVar3 = fVar46 * fVar81;
        pfVar3[1] = fVar46 * fVar83;
        pfVar3[2] = fVar46 * fVar80;
        pfVar3[3] = fVar46 * fVar84;
        fVar48 = fVar65 * fVar41 - fVar58;
        fVar46 = fVar42 * (fVar60 - fVar47) - (fVar63 - fVar72) * fVar43;
        fVar49 = fVar40 * (fVar63 - fVar72) - (fVar64 - fVar54) * fVar42;
        fVar56 = fVar43 * (fVar64 - fVar54) - (fVar60 - fVar47) * fVar40;
        fVar63 = fVar57 * fVar48 - fVar48 * fVar57;
        fVar48 = fVar49 * fVar49;
        fVar60 = fVar56 * fVar56;
        fVar64 = fVar63 * fVar63;
        fVar65 = fVar60 + fVar48 + fVar46 * fVar46;
        fVar80 = fVar64 + fVar48 + fVar48;
        fVar60 = fVar60 + fVar48 + fVar60;
        fVar64 = fVar64 + fVar48 + fVar64;
        auVar68._4_4_ = fVar80;
        auVar68._0_4_ = fVar65;
        auVar68._8_4_ = fVar60;
        auVar68._12_4_ = fVar64;
        auVar8._4_4_ = fVar80;
        auVar8._0_4_ = fVar65;
        auVar8._8_4_ = fVar60;
        auVar8._12_4_ = fVar64;
        auVar67 = rsqrtss(auVar68,auVar8);
        fVar48 = auVar67._0_4_;
        fVar48 = fVar48 * 1.5 - fVar48 * fVar48 * fVar65 * 0.5 * fVar48;
        pfVar3 = (float *)((long)&local_1d8.items[1].field_0 + lVar28 * 2);
        *pfVar3 = fVar48 * fVar49;
        pfVar3[1] = fVar48 * fVar56;
        pfVar3[2] = fVar48 * fVar46;
        pfVar3[3] = fVar48 * fVar63;
        fVar46 = fVar42 * (fVar47 - fVar52) - (fVar72 - fVar53) * fVar43;
        fVar48 = fVar40 * (fVar72 - fVar53) - (fVar54 - fVar55) * fVar42;
        fVar49 = fVar43 * (fVar54 - fVar55) - (fVar47 - fVar52) * fVar40;
        fVar72 = fVar57 * (fVar58 - fVar59) - (fVar58 - fVar59) * fVar57;
        fVar47 = fVar48 * fVar48;
        fVar56 = fVar49 * fVar49;
        fVar54 = fVar72 * fVar72;
        fVar58 = fVar56 + fVar47 + fVar46 * fVar46;
        fVar60 = fVar54 + fVar47 + fVar47;
        fVar56 = fVar56 + fVar47 + fVar56;
        fVar54 = fVar54 + fVar47 + fVar54;
        auVar69._4_4_ = fVar60;
        auVar69._0_4_ = fVar58;
        auVar69._8_4_ = fVar56;
        auVar69._12_4_ = fVar54;
        auVar9._4_4_ = fVar60;
        auVar9._0_4_ = fVar58;
        auVar9._8_4_ = fVar56;
        auVar9._12_4_ = fVar54;
        auVar67 = rsqrtss(auVar69,auVar9);
        fVar47 = auVar67._0_4_;
        fVar47 = fVar47 * 1.5 - fVar47 * fVar47 * fVar58 * 0.5 * fVar47;
        pfVar3 = (float *)((long)&local_1d8.items[2].field_0 + lVar28 * 2);
        *pfVar3 = fVar47 * fVar48;
        pfVar3[1] = fVar47 * fVar49;
        pfVar3[2] = fVar47 * fVar46;
        pfVar3[3] = fVar47 * fVar72;
        fVar52 = fVar52 - auVar50._0_4_;
        fVar53 = fVar53 - auVar50._4_4_;
        fVar55 = fVar55 - auVar50._8_4_;
        fVar59 = fVar59 - auVar50._12_4_;
        fVar49 = fVar42 * fVar52 - fVar53 * fVar43;
        fVar47 = fVar40 * fVar53 - fVar55 * fVar42;
        fVar48 = fVar43 * fVar55 - fVar52 * fVar40;
        fVar56 = fVar57 * fVar59 - fVar59 * fVar57;
        fVar46 = fVar47 * fVar47;
        fVar52 = fVar48 * fVar48;
        fVar72 = fVar56 * fVar56;
        fVar53 = fVar52 + fVar46 + fVar49 * fVar49;
        auVar76._0_8_ = CONCAT44(fVar72 + fVar46 + fVar46,fVar53);
        auVar76._8_4_ = fVar52 + fVar46 + fVar52;
        auVar76._12_4_ = fVar72 + fVar46 + fVar72;
        auVar61._8_4_ = auVar76._8_4_;
        auVar61._0_8_ = auVar76._0_8_;
        auVar61._12_4_ = auVar76._12_4_;
        auVar67 = rsqrtss(auVar61,auVar76);
        fVar46 = auVar67._0_4_;
        fVar46 = fVar46 * 1.5 - fVar46 * fVar46 * fVar53 * 0.5 * fVar46;
        fVar47 = fVar46 * fVar47;
        fVar48 = fVar46 * fVar48;
        fVar49 = fVar46 * fVar49;
        fVar46 = fVar46 * fVar56;
        pvVar12 = &local_1d8;
        lVar20 = lVar29 * 4 + 3;
LAB_001782ad:
        siglen_00 = (pointer)pvVar12->items;
        pfVar3 = ((anon_union_16_2_47237d3f_for_Vec3fx_0 *)&siglen_00->ty)->m128 + lVar20 * 4;
        *pfVar3 = fVar47;
        pfVar3[1] = fVar48;
        pfVar3[2] = fVar49;
        pfVar3[3] = fVar46;
      }
    }
    lVar29 = lVar29 + 1;
    lVar28 = lVar28 + 0x20;
    lVar38 = lVar38 + 2;
  } while( true );
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadFurBall(const Ref<XML>& xml)
  {
    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;

    float r = (xml->parm("radius") != "") ? xml->parm_float("radius") : 10.0f;
    int slices = (xml->parm("slices") != "") ? int(xml->parm_float("slices")) : 60;
    int slabs = (xml->parm("slabs") != "") ? int(xml->parm_float("slabs")) : 60;
    int nhairs = (xml->parm("nhairs") != "") ? int(xml->parm_float("nhairs")) : 30000;
    float hairwidth = (xml->parm("hairwidth") != "") ? int(xml->parm_float("hairwidth")) : (r / 100.0f);
    float hairlength = (xml->parm("hairlength") != "") ? int(xml->parm_float("hairlength")) : (r / 10.0f);
    RTCGeometryType hairtype = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;
    bool is_linear = false;
    bool is_bezier = false;
    bool is_bspline = false;
    bool is_hermite = false;
    bool is_catmulrom = false;
    bool is_normaloriented = false;
    std::string phairtype = xml->parm("hairtype");
    if (phairtype == "linear_flat")                    { hairtype = RTC_GEOMETRY_TYPE_FLAT_LINEAR_CURVE;                  is_linear = true;                               }
    else if (phairtype == "linear_round")              { hairtype = RTC_GEOMETRY_TYPE_ROUND_LINEAR_CURVE;                 is_linear = true;                               }
    else if (phairtype == "bezier_flat")               { hairtype = RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;                  is_bezier = true;                               }
    else if (phairtype == "bezier_round")              { hairtype = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;                 is_bezier = true;                               }
    else if (phairtype == "bezier_normaloriented")     { hairtype = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BEZIER_CURVE;       is_bezier = true;     is_normaloriented = true; }
    else if (phairtype == "bspline_flat")              { hairtype = RTC_GEOMETRY_TYPE_FLAT_BSPLINE_CURVE;                 is_bspline = true;                              }
    else if (phairtype == "bspline_round")             { hairtype = RTC_GEOMETRY_TYPE_ROUND_BSPLINE_CURVE;                is_bspline = true;                              }
    else if (phairtype == "bspline_normaloriented")    { hairtype = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_BSPLINE_CURVE;      is_bspline = true;    is_normaloriented = true; }
    else if (phairtype == "hermite_flat")              { hairtype = RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;                 is_hermite = true;                              }
    else if (phairtype == "hermite_round")             { hairtype = RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE;                is_hermite = true;                              }
    else if (phairtype == "hermite_normaloriented")    { hairtype = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_HERMITE_CURVE;      is_hermite = true;    is_normaloriented = true; }
    else if (phairtype == "catmulrom_flat")            { hairtype = RTC_GEOMETRY_TYPE_FLAT_CATMULL_ROM_CURVE;             is_catmulrom = true;                            }
    else if (phairtype == "catmulrom_round")           { hairtype = RTC_GEOMETRY_TYPE_ROUND_CATMULL_ROM_CURVE;            is_catmulrom = true;                            }
    else if (phairtype == "catmulrom_normaloriented")  { hairtype = RTC_GEOMETRY_TYPE_NORMAL_ORIENTED_CATMULL_ROM_CURVE;  is_catmulrom = true;  is_normaloriented = true; }
    else                                               { hairtype = RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE;                 is_bezier = true;                               }

    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(material,BBox1f(0,1),0);

    {
      avector<Vec3fa> data;
      data.resize(slices * (slabs - 1) + 2);
      data[0] = Vec3fa(0, -r, 0);

      float dphi = float(pi) / float(slabs);
      float dtheta = float(pi) / float(slices) * 2.0f;
      int i = 0;

      for (int slab=0; slab<slabs-1; slab++)
      {
        float phi = dphi * (slab + 1);
        for (int slice=0; slice<slices; slice++)
        {
          float theta = dtheta * slice;
          float x = r * sin(phi) * cos(theta);
          float z = r * sin(phi) * sin(theta);
          float y = r * cos(phi);
          data[i] = Vec3fa(x, y, z);
          i++;
        }
      }

      data[i++] = Vec3fa(0, r, 0);
      data[i++] = Vec3fa(0, -r, 0);
      mesh->positions.push_back(data);
    }

    {
      int top = mesh->positions.back().size() - 2;
      int bot = mesh->positions.back().size() - 1;

      for (int slice=0; slice<slices; slice++)
      {
        mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(top, slice, (slice + 1) % slices));
      }

      for (int slab=0; slab<slabs-2; slab++)
      {
        for (int slice=0; slice<slices; slice++)
        {
          int offset_a = slab * slices;
          int offset_b = (slab + 1) * slices;

          mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(offset_a + slice, offset_b + slice, offset_b + (slice + 1) % slices));
          mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(offset_a + slice, offset_b + (slice + 1) % slices, offset_a + (slice + 1) % slices));
        }
      }

      for (int slice=0; slice<slices; slice++)
      {
        mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(bot, bot - slices - 1 + slice, bot - slices - 1+ (slice + 1) % slices));
      }
    }

    mesh->verify();
    group->add(mesh.dynamicCast<SceneGraph::Node>());

    // generate N random hairs
    Ref<SceneGraph::HairSetNode> hairs = new SceneGraph::HairSetNode(hairtype,material,BBox1f(0,1),0);

    int N = nhairs;

    {
      // rand() is not consistent with linux/win/mac or other compilers, so we use a manual lcg (with similar seeds as used in glibc)
      uint32_t rand_int = 1234;
      uint32_t a = 1103515245;
      uint32_t c = 12345;
      uint32_t m = 1 << 31;
      auto rand_float = [&rand_int, &a, &c, &m]() {
        rand_int = (a * rand_int + c) % m;
        return rand_int / float(m);
      };

      size_t nvertices_per_curve = (is_hermite) ? 2 : 4;

      avector<Vec3ff> pos;
      avector<Vec3fa> norm;
      avector<Vec3ff> tans;
      avector<Vec3fa> dnorm;
      pos.resize(N *  nvertices_per_curve);
      norm.resize(N * nvertices_per_curve);
      if (is_hermite) {
        tans.resize(N * nvertices_per_curve);
        dnorm.resize(N * nvertices_per_curve);
      }

      float theta = 2.0f * float(pi) * rand_float();
      float phi = acos(1 - 2 * rand_float());
      Vec3fa last = Vec3fa(sin(phi) * cos(theta), cos(phi), sin(phi) * sin(theta));

      for (int i = 0; i < N; i++) {
          float theta = 2.0f * float(pi) * rand_float();
          float phi = acos(1 - 2 * rand_float());
          Vec3fa d = Vec3fa(sin(phi) * cos(theta), cos(phi), sin(phi) * sin(theta));

          Vec3fa p = normalize(cross(d, last));
          last = p;

          Vec3fa start = d * r * (1.0f - 0.01f * hairlength);
          Vec3fa mid   = d * r * (1.0f + 0.03f * hairlength);
          Vec3fa mid2  = d * r * (1.0f + 0.07f * hairlength);
          Vec3fa stop  = d * r * (1.0f + 0.07f * hairlength + 0.03f * hairlength * rand_float());

          // Tweak positions based on curve type
          if (is_bezier) {
            stop = stop + p * r * 0.051f * hairlength;
          }
          else if (is_linear) {
            mid  = mid  + p * r * 0.001f * hairlength;
            mid2 = mid2 + p * r * 0.021f * hairlength;
            stop = stop + p * r * 0.051f * hairlength;
          }
          else if (is_bspline) {
            mid2 = mid2 + p * r * 0.021f * hairlength;
            stop  = d * r * (1.0f + 0.07f * hairlength + 0.13f * hairlength * rand_float());
            stop = stop + p * r * 0.081f * hairlength;
          }

          // Hermite only has 2 supports
          if (is_hermite) {
            pos[i*2  ] = Vec3ff(start.x, start.y, start.z, hairwidth);
            pos[i*2+1] = Vec3ff(stop.x, stop.y, stop.z, 0.0f);

            Vec3fa tstart = normalize(d);
            Vec3fa tmid = normalize(p);

            tans[i*2  ] = Vec3ff(tstart.x, tstart.y, tstart.z, 0.2f);
            tans[i*2+1] = Vec3ff(tmid.x, tmid.y, tmid.z, 0.8f);

            norm[i*2  ] = normalize(cross(d, p));
            norm[i*2+1] = normalize(cross(d, p));

            if (is_normaloriented) {
              dnorm[i*2  ] = Vec3fa(0.0f, 0.0f, 0.0f);
              dnorm[i*2+1] = Vec3fa(0.0f, 0.0f, 0.0f);
            }
          }
          else {
            pos[i*4+0] = Vec3ff(start.x, start.y, start.z, hairwidth);
            pos[i*4+1] = Vec3ff(mid.x, mid.y, mid.z, hairwidth);
            pos[i*4+2] = Vec3ff(mid.x, mid2.y, mid2.z, hairwidth * 0.5f);
            pos[i*4+3] = Vec3ff(stop.x, stop.y, stop.z, 0.0f);
          }

          // normals already added, if curve type is hermite
          if (is_normaloriented && !is_hermite) {
            norm[i*4+0] = normalize(cross(d, p));
            norm[i*4+1] = normalize(cross(start - mid, p));
            norm[i*4+2] = normalize(cross(mid - mid2, p));
            norm[i*4+3] = normalize(cross(mid2 - stop, p));
          }
      }

      hairs->positions.push_back(pos);
      if (is_normaloriented) hairs->normals.push_back(norm);
      if (is_hermite) hairs->tangents.push_back(tans);
      if (is_hermite && is_normaloriented) hairs->dnormals.push_back(dnorm);

      // linear uses 3 segments per hair
      if (is_linear) {
        hairs->hairs.resize(N * 3);
        for (size_t i=0; i<N; i++) {
          hairs->hairs[i * 3    ] = SceneGraph::HairSetNode::Hair(i * 4    , i * 3    );
          hairs->hairs[i * 3 + 1] = SceneGraph::HairSetNode::Hair(i * 4 + 1, i * 3 + 1);
          hairs->hairs[i * 3 + 2] = SceneGraph::HairSetNode::Hair(i * 4 + 2, i * 3 + 2);
        }
      }
      // rest uses nvertices_per_curve number of supports
      else {
        hairs->hairs.resize(N);
        for (size_t i=0; i<N; i++) {
          hairs->hairs[i] = SceneGraph::HairSetNode::Hair(i * nvertices_per_curve, i);
        }
      }

      // tweak hairwidth of tips to make bsplines/catmulrom look slightly better
      if (is_bspline || is_catmulrom) {
        for (size_t i=0; i<N; i++) { 
          hairs->positions.back()[i * 4 + 1].w = 0.5f * hairwidth;
          hairs->positions.back()[i * 4 + 2].w = 0.01f * hairwidth;
          hairs->positions.back()[i * 4 + 3].w = 0.0f;
        }
      }

      if (is_bspline) {
        std::vector<unsigned> indices;
        indices.resize(N);
        for (size_t i=0; i<N; i++) { indices[i] = i; }
        for (auto& vertices : hairs->positions)
          fix_bspline_end_points(indices,vertices);
      }

      hairs->verify();
      group->add(hairs.dynamicCast<SceneGraph::Node>());
    }

    return group.dynamicCast<SceneGraph::Node>();
  }